

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_7::MaySetAnnotationVariable
               (Options *options,StringPiece annotation_name,StringPiece substitute_template_prefix,
               StringPiece prepared_template,int field_index,StringPiece access_type,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  StringPiece str;
  StringPiece str_00;
  size_type sVar1;
  mapped_type *this;
  AlphaNum *pAVar2;
  AlphaNum local_3c8;
  AlphaNum local_398;
  string local_368;
  SubstituteArg local_348;
  SubstituteArg local_318;
  SubstituteArg local_2e8;
  SubstituteArg local_2b8;
  SubstituteArg local_288;
  SubstituteArg local_258;
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  char *local_1c8;
  size_type sStack_1c0;
  AlphaNum local_1b8;
  SubstituteArg local_188;
  AlphaNum local_158;
  char *local_128;
  size_type sStack_120;
  AlphaNum local_118;
  Options *local_e8;
  char *pcStack_e0;
  AlphaNum local_d8;
  string local_a8;
  string local_88;
  string local_58;
  int local_34;
  Options *pOStack_30;
  int field_index_local;
  Options *options_local;
  StringPiece substitute_template_prefix_local;
  StringPiece annotation_name_local;
  
  pAVar2 = (AlphaNum *)substitute_template_prefix.length_;
  options_local = (Options *)substitute_template_prefix.ptr_;
  substitute_template_prefix_local.length_ = (size_type)annotation_name.ptr_;
  local_34 = field_index;
  pOStack_30 = options;
  substitute_template_prefix_local.ptr_ = (char *)pAVar2;
  stringpiece_internal::StringPiece::operator_cast_to_string
            (&local_58,(StringPiece *)&substitute_template_prefix_local.length_);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&(options->field_listener_options).forbidden_field_listener_events,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (sVar1 == 0) {
    local_e8 = options_local;
    pcStack_e0 = substitute_template_prefix_local.ptr_;
    str_00.length_ = (size_type)substitute_template_prefix_local.ptr_;
    str_00.ptr_ = (char *)options_local;
    strings::AlphaNum::AlphaNum(&local_d8,str_00);
    local_128 = prepared_template.ptr_;
    sStack_120 = prepared_template.length_;
    strings::AlphaNum::AlphaNum(&local_118,prepared_template);
    strings::AlphaNum::AlphaNum(&local_158,");\n");
    StrCat_abi_cxx11_(&local_a8,(protobuf *)&local_d8,&local_118,&local_158,pAVar2);
    strings::internal::SubstituteArg::SubstituteArg(&local_188,local_34);
    local_1c8 = access_type.ptr_;
    sStack_1c0 = access_type.length_;
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&local_1b8,access_type);
    strings::internal::SubstituteArg::SubstituteArg(&local_1f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_228);
    strings::internal::SubstituteArg::SubstituteArg(&local_258);
    strings::internal::SubstituteArg::SubstituteArg(&local_288);
    strings::internal::SubstituteArg::SubstituteArg(&local_2b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_318);
    strings::internal::SubstituteArg::SubstituteArg(&local_348);
    pAVar2 = &local_1b8;
    strings::Substitute(&local_88,&local_a8,&local_188,(SubstituteArg *)pAVar2,&local_1f8,&local_228
                        ,&local_258,&local_288,&local_2b8,&local_2e8,&local_318,&local_348);
    strings::AlphaNum::AlphaNum(&local_398,"annotate_");
    str.length_ = annotation_name.length_;
    str.ptr_ = (char *)substitute_template_prefix_local.length_;
    strings::AlphaNum::AlphaNum(&local_3c8,str);
    StrCat_abi_cxx11_(&local_368,(protobuf *)&local_398,&local_3c8,pAVar2);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_368);
    std::__cxx11::string::operator=((string *)this,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void MaySetAnnotationVariable(const Options& options,
                              StringPiece annotation_name,
                              StringPiece substitute_template_prefix,
                              StringPiece prepared_template,
                              int field_index, StringPiece access_type,
                              std::map<std::string, std::string>* variables) {
  if (options.field_listener_options.forbidden_field_listener_events.count(
          std::string(annotation_name)))
    return;
  (*variables)[StrCat("annotate_", annotation_name)] = strings::Substitute(
      StrCat(substitute_template_prefix, prepared_template, ");\n"),
      field_index, access_type);
}